

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O3

Am_Value_List
list_final_value(Am_Object *inter,Am_Object *new_object,Am_Object *ref_object,
                Am_Value_List *old_value,bool separate_extend)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_List_Item *extraout_RDX;
  Am_Value_List *this;
  undefined7 in_register_00000081;
  Am_Value_List *this_00;
  char in_R9B;
  int iVar4;
  int iVar5;
  Am_Value_List AVar6;
  Am_Object current;
  Am_Value_List all_objects;
  int stopSet;
  int startSet;
  Am_Object widget;
  int stopErase;
  int startErase;
  Am_Object local_68;
  Am_Value_List local_60;
  int local_4c;
  int local_48;
  int local_44;
  Am_Object local_40;
  int local_38;
  int local_34;
  
  this_00 = (Am_Value_List *)CONCAT71(in_register_00000081,separate_extend);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)new_object,10);
  pAVar2 = Am_Object::Get(&local_40,0x82,0);
  Am_Value_List::Am_Value_List(&local_60,pAVar2);
  Am_Value_List::Am_Value_List((Am_Value_List *)inter);
  local_68.data = (Am_Object_Data *)0x0;
  calc_ranks(&local_44,&local_48,&local_34,&local_38,&Am_No_Object,ref_object,(Am_Object *)old_value
            );
  this = &local_60;
  Am_Value_List::Start(this);
  if (local_44 != -1) {
    if (local_44 < 1) {
      iVar5 = 0;
    }
    else {
      local_4c = local_44;
      iVar4 = local_44;
      do {
        if (in_R9B != '\0') {
          pAVar2 = Am_Value_List::Get(&local_60);
          Am_Object::operator=(&local_68,pAVar2);
          Am_Value_List::Start(this_00);
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
          bVar1 = Am_Value_List::Member(this_00,pAVar3);
          if (bVar1) {
            pAVar2 = Am_Object::Get(&local_68,0xcc,0);
            bVar1 = Am_Value::Valid(pAVar2);
            if (bVar1) {
              pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
              Am_Value_List::Add((Am_Value_List *)inter,pAVar3,Am_TAIL,true);
            }
          }
        }
        this = &local_60;
        Am_Value_List::Next(&local_60);
        iVar4 = iVar4 + -1;
        iVar5 = local_4c;
      } while (iVar4 != 0);
    }
    if (iVar5 <= local_48) {
      iVar5 = (local_48 - iVar5) + 1;
      do {
        pAVar2 = Am_Value_List::Get(&local_60);
        Am_Object::operator=(&local_68,pAVar2);
        pAVar2 = Am_Object::Get(&local_68,0xcc,0);
        bVar1 = Am_Value::Valid(pAVar2);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
          Am_Value_List::Add((Am_Value_List *)inter,pAVar3,Am_TAIL,true);
        }
        this = &local_60;
        Am_Value_List::Next(&local_60);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  if (in_R9B != '\0') {
    while (this = &local_60, bVar1 = Am_Value_List::Last(&local_60), !bVar1) {
      pAVar2 = Am_Value_List::Get(&local_60);
      Am_Object::operator=(&local_68,pAVar2);
      Am_Value_List::Start(this_00);
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
      bVar1 = Am_Value_List::Member(this_00,pAVar3);
      if (bVar1) {
        pAVar2 = Am_Object::Get(&local_68,0xcc,0);
        bVar1 = Am_Value::Valid(pAVar2);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
          Am_Value_List::Add((Am_Value_List *)inter,pAVar3,Am_TAIL,true);
        }
      }
      Am_Value_List::Next(&local_60);
    }
  }
  set_selected_from_list((Am_Object *)this,&local_60,(Am_Value_List *)inter);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(&local_40);
  AVar6.item = extraout_RDX;
  AVar6.data = (Am_Value_List_Data *)inter;
  return AVar6;
}

Assistant:

Am_Value_List
list_final_value(Am_Object &inter, Am_Object &new_object, Am_Object &ref_object,
                 Am_Value_List &old_value, bool separate_extend)
{
  Am_Object widget = inter.Get_Owner();
  Am_Value_List all_objects = widget.Get(Am_GRAPHICAL_PARTS);
  Am_Value_List new_value;
  Am_Object current;

  int startSet, stopSet, startErase, stopErase;
  calc_ranks(startSet, stopSet, startErase, stopErase, Am_No_Object, new_object,
             ref_object);
  all_objects.Start();
  if (startSet != -1) {
    int i;
    for (i = 0; i < startSet; all_objects.Next(), i++) {
      if (separate_extend) { //otherwise, just ignore these
        current = all_objects.Get();
        old_value.Start();
        if (old_value.Member(current)) {
          if (current.Get(Am_ACTIVE).Valid())
            new_value.Add(current);
        }
      }
    }
    for (; i <= stopSet; all_objects.Next(), i++) {
      current = all_objects.Get();
      if (current.Get(Am_ACTIVE).Valid())
        new_value.Add(current);
    }
  }
  if (separate_extend) { //process the rest of the list
    //start from current position in the list
    for (; !all_objects.Last(); all_objects.Next()) {
      current = all_objects.Get();
      old_value.Start();
      if (old_value.Member(current))
        if (current.Get(Am_ACTIVE).Valid())
          new_value.Add(current);
    }
  }
  //now new_value has the final value
  set_selected_from_list(inter, all_objects, new_value);
  return new_value;
}